

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_mtree.c
# Opt level: O0

void test_write_format_mtree_sub2(int use_set,int dironly)

{
  char *pcVar1;
  int in_ESI;
  int in_EDI;
  char *o;
  char *r;
  char *p;
  char str [32];
  int i;
  size_t used;
  archive *a;
  archive_entry *ae;
  void *in_stack_ffffffffffffff48;
  archive *a_00;
  archive_entry *paVar2;
  undefined4 in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff54;
  char *in_stack_ffffffffffffff58;
  archive *in_stack_ffffffffffffff60;
  archive *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  wchar_t wVar3;
  char *in_stack_ffffffffffffff78;
  void *in_stack_ffffffffffffff80;
  void *in_stack_ffffffffffffff90;
  ulong in_stack_ffffffffffffff98;
  char local_48 [2];
  char acStack_46 [34];
  int local_24;
  long local_20;
  archive_entry *local_18;
  archive_entry *local_10;
  int local_8;
  int local_4;
  
  local_8 = in_ESI;
  local_4 = in_EDI;
  local_18 = (archive_entry *)archive_write_new();
  assertion_assert((char *)in_stack_ffffffffffffff60,
                   (wchar_t)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffff58,
                   (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   in_stack_ffffffffffffff48);
  archive_write_set_format_mtree((archive *)0x2029d8);
  paVar2 = local_18;
  assertion_equal_int((char *)in_stack_ffffffffffffff68,
                      (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                      (longlong)in_stack_ffffffffffffff58,
                      (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                      (longlong)local_18,(char *)0x202a0a,in_stack_ffffffffffffff80);
  if (local_4 != 0) {
    archive_write_set_format_option
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
               (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),(char *)paVar2)
    ;
    paVar2 = local_18;
    assertion_equal_int((char *)in_stack_ffffffffffffff68,
                        (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                        (longlong)in_stack_ffffffffffffff58,
                        (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                        (longlong)local_18,(char *)0x202a65,in_stack_ffffffffffffff80);
  }
  if (local_8 != 0) {
    archive_write_set_format_option
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
               (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),(char *)paVar2)
    ;
    assertion_equal_int((char *)in_stack_ffffffffffffff68,
                        (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                        (longlong)in_stack_ffffffffffffff58,
                        (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                        (longlong)local_18,(char *)0x202ac0,in_stack_ffffffffffffff80);
  }
  archive_write_open_memory
            (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58,
             (size_t *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  paVar2 = local_18;
  assertion_equal_int((char *)in_stack_ffffffffffffff68,
                      (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                      (longlong)in_stack_ffffffffffffff58,
                      (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                      (longlong)local_18,(char *)0x202b13,in_stack_ffffffffffffff80);
  local_24 = 0;
  while (wVar3 = (wchar_t)((ulong)in_stack_ffffffffffffff70 >> 0x20),
        entries2[local_24].path != (char *)0x0) {
    local_10 = archive_entry_new();
    assertion_assert((char *)in_stack_ffffffffffffff60,
                     (wchar_t)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                     (wchar_t)in_stack_ffffffffffffff58,
                     (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),paVar2);
    archive_entry_set_mtime(local_10,entries2[local_24].mtime,0);
    in_stack_ffffffffffffff80 = (void *)entries2[local_24].mtime;
    archive_entry_mtime(local_10);
    assertion_assert((char *)in_stack_ffffffffffffff60,
                     (wchar_t)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                     (wchar_t)in_stack_ffffffffffffff58,
                     (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),paVar2);
    archive_entry_set_mode(local_10,entries2[local_24].mode);
    archive_entry_mode(local_10);
    assertion_assert((char *)in_stack_ffffffffffffff60,
                     (wchar_t)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                     (wchar_t)in_stack_ffffffffffffff58,
                     (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),paVar2);
    archive_entry_set_uid(local_10,(ulong)entries2[local_24].uid);
    in_stack_ffffffffffffff90 = (void *)(ulong)entries2[local_24].uid;
    archive_entry_uid(local_10);
    assertion_assert((char *)in_stack_ffffffffffffff60,
                     (wchar_t)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                     (wchar_t)in_stack_ffffffffffffff58,
                     (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),paVar2);
    archive_entry_set_gid(local_10,(ulong)entries2[local_24].gid);
    in_stack_ffffffffffffff98 = (ulong)entries2[local_24].gid;
    archive_entry_gid(local_10);
    assertion_assert((char *)in_stack_ffffffffffffff60,
                     (wchar_t)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                     (wchar_t)in_stack_ffffffffffffff58,
                     (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),paVar2);
    archive_entry_copy_pathname
              ((archive_entry *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               (char *)paVar2);
    if ((entries2[local_24].mode & 0xf000) != 0x4000) {
      archive_entry_set_size(local_10,8);
    }
    archive_write_header
              ((archive *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),paVar2);
    paVar2 = local_18;
    assertion_equal_int((char *)in_stack_ffffffffffffff68,
                        (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                        (longlong)in_stack_ffffffffffffff58,
                        (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                        (longlong)local_18,(char *)0x202e22,in_stack_ffffffffffffff80);
    if ((entries2[local_24].mode & 0xf000) != 0x4000) {
      archive_write_data((archive *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         paVar2,0x202e60);
      paVar2 = local_18;
      assertion_equal_int((char *)in_stack_ffffffffffffff68,
                          (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                          (longlong)in_stack_ffffffffffffff58,
                          (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                          (longlong)local_18,(char *)0x202e93,in_stack_ffffffffffffff80);
    }
    archive_entry_free((archive_entry *)0x202ea0);
    local_24 = local_24 + 1;
  }
  archive_write_close((archive *)0x202ec3);
  assertion_equal_int((char *)in_stack_ffffffffffffff68,
                      (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                      (longlong)in_stack_ffffffffffffff58,
                      (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                      (longlong)local_18,(char *)0x202ef5,in_stack_ffffffffffffff80);
  archive_write_free((archive *)0x202f02);
  a_00 = (archive *)0x0;
  assertion_equal_int((char *)in_stack_ffffffffffffff68,
                      (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                      (longlong)in_stack_ffffffffffffff58,
                      (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),0,
                      (char *)0x202f30,in_stack_ffffffffffffff80);
  if (local_4 != 0) {
    buff[local_20] = '\0';
    pcVar1 = strstr(buff,"\n/set ");
    assertion_assert((char *)in_stack_ffffffffffffff60,
                     (wchar_t)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                     (wchar_t)in_stack_ffffffffffffff58,
                     (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),a_00);
    if (pcVar1 != (char *)0x0) {
      pcVar1 = strchr(pcVar1 + 1,10);
      if (pcVar1 != (char *)0x0) {
        *pcVar1 = '\0';
      }
      a_00 = (archive *)0x0;
      in_stack_ffffffffffffff50 = 0;
      assertion_equal_string
                (in_stack_ffffffffffffff78,wVar3,(char *)in_stack_ffffffffffffff68,
                 (char *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                 (char *)((ulong)in_stack_ffffffffffffff54 << 0x20),in_stack_ffffffffffffff90,
                 (wchar_t)in_stack_ffffffffffffff98);
      if (pcVar1 != (char *)0x0) {
        *pcVar1 = '\n';
      }
    }
  }
  local_18 = (archive_entry *)archive_read_new();
  assertion_assert((char *)in_stack_ffffffffffffff60,
                   (wchar_t)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffff58,
                   (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),a_00);
  archive_read_support_format_all(a_00);
  paVar2 = local_18;
  assertion_equal_int((char *)in_stack_ffffffffffffff68,
                      (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                      (longlong)in_stack_ffffffffffffff58,
                      (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                      (longlong)local_18,(char *)0x2030be,in_stack_ffffffffffffff80);
  archive_read_support_filter_all((archive *)paVar2);
  paVar2 = local_18;
  assertion_equal_int((char *)in_stack_ffffffffffffff68,
                      (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                      (longlong)in_stack_ffffffffffffff58,
                      (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                      (longlong)local_18,(char *)0x2030fd,in_stack_ffffffffffffff80);
  archive_read_open_memory
            ((archive *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),paVar2,
             0x203119);
  paVar2 = local_18;
  assertion_equal_int((char *)in_stack_ffffffffffffff68,
                      (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                      (longlong)in_stack_ffffffffffffff58,
                      (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                      (longlong)local_18,(char *)0x20314b,in_stack_ffffffffffffff80);
  memset(local_48,0,0x20);
  strcpy(local_48,"./");
  local_24 = 0;
  while (wVar3 = (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
        entries2[local_24].path != (char *)0x0) {
    if ((local_8 == 0) || ((entries2[local_24].mode & 0xf000) == 0x4000)) {
      archive_read_next_header
                ((archive *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 (archive_entry **)paVar2);
      assertion_equal_int((char *)in_stack_ffffffffffffff68,wVar3,
                          (longlong)in_stack_ffffffffffffff58,
                          (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                          (longlong)local_18,(char *)0x203213,in_stack_ffffffffffffff80);
      in_stack_ffffffffffffff58 = (char *)entries2[local_24].mtime;
      archive_entry_mtime(local_10);
      assertion_equal_int((char *)in_stack_ffffffffffffff68,wVar3,
                          (longlong)in_stack_ffffffffffffff58,
                          (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),0,
                          (char *)0x203270,in_stack_ffffffffffffff80);
      in_stack_ffffffffffffff60 = (archive *)(ulong)entries2[local_24].mode;
      archive_entry_mode(local_10);
      assertion_equal_int((char *)in_stack_ffffffffffffff68,
                          (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                          (longlong)in_stack_ffffffffffffff58,
                          (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),0,
                          (char *)0x2032ce,in_stack_ffffffffffffff80);
      in_stack_ffffffffffffff68 = (archive *)(ulong)entries2[local_24].uid;
      archive_entry_uid(local_10);
      assertion_equal_int((char *)in_stack_ffffffffffffff68,
                          (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                          (longlong)in_stack_ffffffffffffff58,
                          (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),0,
                          (char *)0x20332a,in_stack_ffffffffffffff80);
      wVar3 = L'\0';
      archive_entry_gid(local_10);
      paVar2 = (archive_entry *)0x0;
      assertion_equal_int((char *)in_stack_ffffffffffffff68,
                          (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                          (longlong)in_stack_ffffffffffffff58,
                          (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),0,
                          (char *)0x203386,in_stack_ffffffffffffff80);
      strcpy(acStack_46,entries2[local_24].path);
      pcVar1 = local_48;
      archive_entry_pathname(paVar2);
      paVar2 = (archive_entry *)0x0;
      in_stack_ffffffffffffff50 = 0;
      assertion_equal_string
                (pcVar1,wVar3,(char *)in_stack_ffffffffffffff68,(char *)in_stack_ffffffffffffff60,
                 in_stack_ffffffffffffff58,(char *)((ulong)in_stack_ffffffffffffff54 << 0x20),
                 in_stack_ffffffffffffff90,(wchar_t)in_stack_ffffffffffffff98);
      if ((entries2[local_24].mode & 0xf000) != 0x4000) {
        archive_entry_size(local_10);
        paVar2 = (archive_entry *)0x0;
        assertion_equal_int((char *)in_stack_ffffffffffffff68,
                            (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),0,
                            (char *)0x203462,in_stack_ffffffffffffff80);
      }
    }
    local_24 = local_24 + 1;
  }
  archive_read_close((archive *)0x203487);
  assertion_equal_int((char *)in_stack_ffffffffffffff68,wVar3,(longlong)in_stack_ffffffffffffff58,
                      (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                      (longlong)local_18,(char *)0x2034b9,in_stack_ffffffffffffff80);
  archive_read_free((archive *)0x2034c6);
  assertion_equal_int((char *)in_stack_ffffffffffffff68,wVar3,(longlong)in_stack_ffffffffffffff58,
                      (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),0,
                      (char *)0x2034f4,in_stack_ffffffffffffff80);
  return;
}

Assistant:

static void
test_write_format_mtree_sub2(int use_set, int dironly)
{
  struct archive_entry *ae;
  struct archive* a;
  size_t used;
  int i;
  char str[32];

  /* Create a mtree format archive. */
  assert((a = archive_write_new()) != NULL);
  assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_mtree(a));
  if (use_set)
    assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_option(a, NULL, "use-set", "1"));
  if (dironly)
    assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_option(a, NULL, "dironly", "1"));
  assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, sizeof(buff)-1, &used));

  /* Write entries2 */
  for (i = 0; entries2[i].path != NULL; i++) {
    assert((ae = archive_entry_new()) != NULL);
    archive_entry_set_mtime(ae, entries2[i].mtime, 0);
    assert(entries2[i].mtime == archive_entry_mtime(ae));
    archive_entry_set_mode(ae, entries2[i].mode);
    assert(entries2[i].mode == archive_entry_mode(ae));
    archive_entry_set_uid(ae, entries2[i].uid);
    assert(entries2[i].uid == archive_entry_uid(ae));
    archive_entry_set_gid(ae, entries2[i].gid);
    assert(entries2[i].gid == archive_entry_gid(ae));
    archive_entry_copy_pathname(ae, entries2[i].path);
    if ((entries2[i].mode & AE_IFMT) != S_IFDIR)
      archive_entry_set_size(ae, 8);
    assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
    if ((entries2[i].mode & AE_IFMT) != S_IFDIR)
      assertEqualIntA(a, 8,
          archive_write_data(a, "Hello012", 15));
    archive_entry_free(ae);
  }
  assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
        assertEqualInt(ARCHIVE_OK, archive_write_free(a));

  if (use_set) {
    const char *p;

    buff[used] = '\0';
    assert(NULL != (p = strstr(buff, "\n/set ")));
    if (p != NULL) {
      char *r;
      const char *o;
      p++;
      r = strchr(p, '\n');
      if (r != NULL)
        *r = '\0';
      if (dironly)
        o = "/set type=dir uid=1001 gid=1001 mode=755";
      else
        o = "/set type=file uid=1001 gid=1001 mode=644";
      assertEqualString(o, p);
      if (r != NULL)
        *r = '\n';
    }
  }

  /*
   * Read the data and check it.
   */
  assert((a = archive_read_new()) != NULL);
  assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
  assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
  assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff, used));

  /* Read entries2 */
  memset(str, 0, sizeof(str));
  strcpy(str, "./");
  for (i = 0; entries2[i].path != NULL; i++) {
    if (dironly && (entries2[i].mode & AE_IFMT) != S_IFDIR)
      continue;
    assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
    assertEqualInt(entries2[i].mtime, archive_entry_mtime(ae));
    assertEqualInt(entries2[i].mode, archive_entry_mode(ae));
    assertEqualInt(entries2[i].uid, archive_entry_uid(ae));
    assertEqualInt(entries2[i].gid, archive_entry_gid(ae));
    strcpy(str + 2, entries2[i].path);
    assertEqualString(str, archive_entry_pathname(ae));
    if ((entries2[i].mode & AE_IFMT) != S_IFDIR)
      assertEqualInt(8, archive_entry_size(ae));
  }
  assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
  assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}